

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

void __thiscall tetgenmesh::transfernodes(tetgenmesh *this)

{
  double *pdVar1;
  uint uVar2;
  int iVar3;
  double *pdVar4;
  tetgenbehavior *ptVar5;
  pointparam *ppVar6;
  point in_RAX;
  tetgenio *ptVar7;
  long lVar8;
  ulong uVar9;
  double *pdVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  bool bVar14;
  ulong uVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  point pointloop;
  
  ptVar7 = this->in;
  lVar8 = 0;
  lVar11 = 0;
  lVar13 = 0;
  pointloop = in_RAX;
  for (lVar12 = 0; lVar12 < ptVar7->numberofpoints; lVar12 = lVar12 + 1) {
    makepoint(this,&pointloop,UNUSEDVERTEX);
    ptVar7 = this->in;
    pdVar4 = ptVar7->pointlist;
    dVar16 = pdVar4[lVar8];
    *pointloop = dVar16;
    dVar17 = pdVar4[lVar8 + 1];
    pointloop[1] = dVar17;
    dVar18 = pdVar4[lVar8 + 2];
    pointloop[2] = dVar18;
    uVar2 = ptVar7->numberofpointattributes;
    pdVar4 = pointloop + 3;
    lVar11 = (long)(int)lVar11;
    uVar9 = 0;
    pdVar10 = pdVar4;
    if (0 < (int)uVar2) {
      uVar9 = (ulong)uVar2;
    }
    while (bVar14 = uVar9 != 0, uVar9 = uVar9 - 1, bVar14) {
      pdVar1 = ptVar7->pointattributelist + lVar11;
      lVar11 = lVar11 + 1;
      *pdVar10 = *pdVar1;
      pdVar10 = pdVar10 + 1;
    }
    lVar8 = lVar8 + 3;
    lVar13 = (long)(int)lVar13;
    uVar9 = (ulong)(uint)ptVar7->numberofpointmtrs;
    if (ptVar7->numberofpointmtrs < 1) {
      uVar9 = 0;
    }
    pdVar10 = pointloop + this->pointmtrindex;
    while (bVar14 = uVar9 != 0, uVar9 = uVar9 - 1, bVar14) {
      pdVar1 = ptVar7->pointmtrlist + lVar13;
      lVar13 = lVar13 + 1;
      *pdVar10 = *pdVar1;
      pdVar10 = pdVar10 + 1;
    }
    ptVar5 = this->b;
    if (ptVar5->weighted != 0) {
      if ((int)uVar2 < 1) {
        dVar19 = ABS(dVar17);
        if (ABS(dVar17) <= ABS(dVar16)) {
          dVar19 = ABS(dVar16);
        }
        if (dVar19 < ABS(dVar18)) {
          dVar19 = ABS(dVar18);
        }
      }
      else {
        dVar19 = *pdVar4;
      }
      if (ptVar5->weighted_param == 0) {
        dVar19 = (dVar18 * dVar18 + dVar16 * dVar16 + dVar17 * dVar17) - dVar19;
      }
      *pdVar4 = dVar19;
    }
    if (lVar12 == 0) {
      this->ymax = dVar17;
      this->ymin = dVar17;
      this->xmax = dVar16;
      this->xmin = dVar16;
      this->zmax = dVar18;
      this->zmin = dVar18;
    }
    else {
      uVar9 = -(ulong)(this->xmax < dVar16);
      uVar15 = -(ulong)(dVar16 < this->xmin);
      this->xmax = (double)(~uVar9 & (ulong)this->xmax | (ulong)dVar16 & uVar9);
      this->xmin = (double)(~uVar15 & (ulong)this->xmin | (ulong)dVar16 & uVar15);
      uVar9 = -(ulong)(this->ymax < dVar17);
      uVar15 = -(ulong)(dVar17 < this->ymin);
      this->ymax = (double)(~uVar9 & (ulong)this->ymax | (ulong)dVar17 & uVar9);
      this->ymin = (double)(~uVar15 & (ulong)this->ymin | (ulong)dVar17 & uVar15);
      uVar9 = -(ulong)(this->zmax < dVar18);
      uVar15 = -(ulong)(dVar18 < this->zmin);
      this->zmax = (double)(~uVar9 & (ulong)this->zmax | (ulong)dVar18 & uVar9);
      this->zmin = (double)(~uVar15 & (ulong)this->zmin | (ulong)dVar18 & uVar15);
    }
    if (ptVar5->psc != 0) {
      ppVar6 = ptVar7->pointparamlist;
      iVar3 = this->pointparamindex;
      pointloop[iVar3] = ppVar6[lVar12].uv[0];
      pointloop[(long)iVar3 + 1] = ppVar6[lVar12].uv[1];
      *(int *)((long)pointloop + (long)this->pointmarkindex * 4 + 8) = ppVar6[lVar12].tag;
      if ((ulong)(uint)ppVar6[lVar12].type < 4) {
        *(uint *)((long)pointloop + (long)this->pointmarkindex * 4 + 4) =
             (uint)*(byte *)((long)pointloop + (long)this->pointmarkindex * 4 + 4) |
             *(uint *)(&DAT_00168760 + (ulong)(uint)ppVar6[lVar12].type * 4);
      }
    }
  }
  dVar16 = this->xmax - this->xmin;
  dVar17 = this->ymax - this->ymin;
  dVar18 = this->zmax - this->zmin;
  dVar16 = SQRT(dVar18 * dVar18 + dVar16 * dVar16 + dVar17 * dVar17);
  this->longest = dVar16;
  if ((dVar16 == 0.0) && (!NAN(dVar16))) {
    puts("Error:  The point set is trivial.");
    terminatetetgen(this,10);
    dVar16 = this->longest;
  }
  this->minedgelength = dVar16 * this->b->epsilon;
  return;
}

Assistant:

void tetgenmesh::transfernodes()
{
  point pointloop;
  REAL x, y, z, w;
  int coordindex;
  int attribindex;
  int mtrindex;
  int i, j;

  // Read the points.
  coordindex = 0;
  attribindex = 0;
  mtrindex = 0;
  for (i = 0; i < in->numberofpoints; i++) {
    makepoint(&pointloop, UNUSEDVERTEX);
    // Read the point coordinates.
    x = pointloop[0] = in->pointlist[coordindex++];
    y = pointloop[1] = in->pointlist[coordindex++];
    z = pointloop[2] = in->pointlist[coordindex++];
    // Read the point attributes. (Including point weights.)
    for (j = 0; j < in->numberofpointattributes; j++) {
      pointloop[3 + j] = in->pointattributelist[attribindex++];
    }
    // Read the point metric tensor.
    for (j = 0; j < in->numberofpointmtrs; j++) {
      pointloop[pointmtrindex + j] = in->pointmtrlist[mtrindex++];
    }
    if (b->weighted) { // -w option
      if (in->numberofpointattributes > 0) {
        // The first point attribute is its weight.
        //w = in->pointattributelist[in->numberofpointattributes * i];
        w = pointloop[3];
      } else {
        // No given weight available. Default choose the maximum
        //   absolute value among its coordinates.        
        w = fabs(x);
        if (w < fabs(y)) w = fabs(y);
        if (w < fabs(z)) w = fabs(z);
      }
      if (b->weighted_param == 0) {
        pointloop[3] = x * x + y * y + z * z - w; // Weighted DT.
      } else { // -w1 option
        pointloop[3] = w;  // Regular tetrahedralization.
      }
    }
    // Determine the smallest and largest x, y and z coordinates.
    if (i == 0) {
      xmin = xmax = x;
      ymin = ymax = y;
      zmin = zmax = z;
    } else {
      xmin = (x < xmin) ? x : xmin;
      xmax = (x > xmax) ? x : xmax;
      ymin = (y < ymin) ? y : ymin;
      ymax = (y > ymax) ? y : ymax;
      zmin = (z < zmin) ? z : zmin;
      zmax = (z > zmax) ? z : zmax;
    }
    if (b->psc) {
      // Read the geometry parameters.
      setpointgeomuv(pointloop, 0, in->pointparamlist[i].uv[0]);
      setpointgeomuv(pointloop, 1, in->pointparamlist[i].uv[1]);
      setpointgeomtag(pointloop, in->pointparamlist[i].tag);
      if (in->pointparamlist[i].type == 0) {
        setpointtype(pointloop, RIDGEVERTEX);
      } else if (in->pointparamlist[i].type == 1) {
        setpointtype(pointloop, FREESEGVERTEX);
      } else if (in->pointparamlist[i].type == 2) {
        setpointtype(pointloop, FREEFACETVERTEX);
      } else if (in->pointparamlist[i].type == 3) {
        setpointtype(pointloop, FREEVOLVERTEX);
      }
    }
  }

  // 'longest' is the largest possible edge length formed by input vertices.
  x = xmax - xmin;
  y = ymax - ymin;
  z = zmax - zmin;
  longest = sqrt(x * x + y * y + z * z);
  if (longest == 0.0) {
    printf("Error:  The point set is trivial.\n");
    terminatetetgen(this, 10);
  }
  // Two identical points are distinguished by 'minedgelength'.
  minedgelength = longest * b->epsilon;
}